

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

_Bool sx_signal_wait(sx_signal *sig,int msecs)

{
  code *pcVar1;
  undefined1 uVar2;
  int iVar3;
  timespec ts;
  timespec local_28;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)sig);
  if (iVar3 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x17f,"r == 0");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  if (msecs == -1) {
    iVar3 = pthread_cond_wait((pthread_cond_t *)(sig->data + 0x28),(pthread_mutex_t *)sig);
  }
  else {
    clock_gettime(0,&local_28);
    local_28.tv_nsec = (long)msecs * 1000000 + local_28.tv_nsec + local_28.tv_sec * 1000000000;
    local_28.tv_sec = (ulong)local_28.tv_nsec / 1000000000;
    local_28.tv_nsec = (ulong)local_28.tv_nsec % 1000000000;
    iVar3 = pthread_cond_timedwait
                      ((pthread_cond_t *)(sig->data + 0x28),(pthread_mutex_t *)sig,&local_28);
  }
  if (iVar3 == 0) {
    sig->data[0x58] = '\0';
    sig->data[0x59] = '\0';
    sig->data[0x5a] = '\0';
    sig->data[0x5b] = '\0';
  }
  pthread_mutex_unlock((pthread_mutex_t *)sig);
  return iVar3 == 0;
}

Assistant:

bool sx_signal_wait(sx_signal* sig, int msecs)
{
    sx__signal* _sig = (sx__signal*)sig->data;
    int r = pthread_mutex_lock(&_sig->mutex);
    sx_assert(r == 0);

    if (msecs == -1) {
        r = pthread_cond_wait(&_sig->cond, &_sig->mutex);
    } else {
        struct timespec ts;
        clock_gettime(CLOCK_REALTIME, &ts);
        sx__tm_add(&ts, msecs);
        r = pthread_cond_timedwait(&_sig->cond, &_sig->mutex, &ts);
    }

    bool ok = r == 0;
    if (ok)
        _sig->value = 0;
    r = pthread_mutex_unlock(&_sig->mutex);
    sx_unused(r);
    return ok;
}